

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalable_decoder.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  AvxInputContext *pAVar2;
  aom_codec_err_t aVar3;
  int iVar4;
  FILE *pFVar5;
  aom_codec_iface_t *iface;
  char *pcVar6;
  size_t sVar7;
  FILE *pFVar8;
  aom_image_t *src;
  aom_image_t *dst;
  ulong uVar9;
  uint uVar10;
  size_t bytes_in_buffer;
  uint8_t *buf;
  size_t buffer_size;
  aom_codec_stream_info_t si;
  aom_codec_iter_t iter;
  ObuDecInputContext obu_ctx;
  aom_codec_ctx_t codec;
  FILE *outfile [5];
  uint8_t tmpbuf [32];
  char filename [80];
  AvxInputContext aom_input_ctx;
  size_t local_288;
  uint8_t *local_280;
  size_t local_278;
  aom_codec_stream_info_t local_270;
  FILE *local_258;
  aom_codec_iter_t local_250;
  ObuDecInputContext local_248;
  aom_codec_ctx_t local_220;
  FILE *local_1e8 [6];
  uint8_t local_1b8 [32];
  char local_198 [88];
  AvxInputContext local_140;
  
  local_280 = (uint8_t *)0x0;
  local_288 = 0;
  local_278 = 0;
  local_248.buffer = (uint8_t *)0x0;
  local_248.is_annexb = 0;
  local_248._36_4_ = 0;
  local_248.buffer_capacity = 0;
  local_248.bytes_buffered = 0;
  local_248.avx_ctx = &local_140;
  exec_name = *argv;
  if (argc == 2) {
    pFVar5 = fopen64(argv[1],"rb");
    pAVar2 = local_248.avx_ctx;
    if (pFVar5 == (FILE *)0x0) {
      die("Failed to open %s for read.",argv[1]);
    }
    (local_248.avx_ctx)->file = (FILE *)pFVar5;
    pAVar2->filename = argv[1];
    iface = get_aom_decoder_by_index(0);
    pcVar6 = aom_codec_iface_name(iface);
    printf("Using %s\n",pcVar6);
    aVar3 = aom_codec_dec_init_ver(&local_220,iface,(aom_codec_dec_cfg_t *)0x0,0,0x16);
    if (aVar3 == AOM_CODEC_OK) {
      aVar3 = aom_codec_control(&local_220,0x118,1);
      if (aVar3 == AOM_CODEC_OK) {
        sVar7 = fread(local_1b8,1,0x20,pFVar5);
        if (sVar7 == 0x20) {
          local_270.is_annexb = 0;
          aVar3 = aom_codec_peek_stream_info(iface,local_1b8,0x20,&local_270);
          if (aVar3 == AOM_CODEC_OK) {
            fseek(pFVar5,-0x20,1);
            iVar4 = file_is_obu(&local_248);
            if (iVar4 != 0) {
              snprintf(local_198,0x50,"out_lyr%d.yuv",0);
              local_1e8[0] = fopen64(local_198,"wb");
              if (local_1e8[0] == (FILE *)0x0) {
                pcVar6 = "Failed top open output for writing.";
                goto LAB_0011e46b;
              }
              if (1 < local_270.number_spatial_layers) {
                uVar9 = 1;
                do {
                  snprintf(local_198,0x50,"out_lyr%u.yuv",uVar9 & 0xffffffff);
                  pFVar8 = fopen64(local_198,"wb");
                  local_1e8[uVar9] = pFVar8;
                  if (pFVar8 == (FILE *)0x0) {
                    pcVar6 = "Failed to open output for writing.";
                    goto LAB_0011e46b;
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar9 < local_270.number_spatial_layers);
              }
              local_258 = pFVar5;
              iVar4 = obudec_read_temporal_unit(&local_248,&local_280,&local_288,&local_278);
              pFVar5 = local_1e8[0];
              uVar10 = 0;
              if (iVar4 == 0) {
                uVar9 = 0;
                do {
                  local_250 = (aom_codec_iter_t)0x0;
                  aVar3 = aom_codec_decode(&local_220,local_280,local_288,(void *)0x0);
                  if (aVar3 != AOM_CODEC_OK) {
                    pcVar6 = "Failed to decode frame.";
                    goto LAB_0011e45a;
                  }
                  while( true ) {
                    uVar10 = (uint)uVar9;
                    src = aom_codec_get_frame(&local_220,&local_250);
                    if (src == (aom_image_t *)0x0) break;
                    dst = aom_img_alloc((aom_image_t *)0x0,AOM_IMG_FMT_I420,src->d_w,src->d_h,0x10);
                    dst->bit_depth = 8;
                    aom_img_downshift(dst,src,src->bit_depth - 8);
                    uVar1 = src->spatial_id;
                    if (uVar1 == 0) {
                      printf("Writing        base layer 0 %d\n",uVar9);
                      pFVar8 = pFVar5;
                    }
                    else {
                      if ((int)(local_270.number_spatial_layers - 1) < (int)uVar1) {
                        pcVar6 = "Invalid bitstream. Layer id exceeds layer count";
                        goto LAB_0011e45a;
                      }
                      printf("Writing enhancement layer %d %d\n",(ulong)uVar1,uVar9);
                      pFVar8 = local_1e8[src->spatial_id];
                    }
                    aom_img_write(dst,(FILE *)pFVar8);
                    uVar9 = (ulong)(uVar10 + (src->spatial_id == local_270.number_spatial_layers - 1
                                             ));
                  }
                  iVar4 = obudec_read_temporal_unit(&local_248,&local_280,&local_288,&local_278);
                } while (iVar4 == 0);
              }
              printf("Processed %d frames.\n",(ulong)uVar10);
              aVar3 = aom_codec_destroy(&local_220);
              pFVar5 = local_258;
              if (aVar3 == AOM_CODEC_OK) {
                if (local_270.number_spatial_layers != 0) {
                  uVar9 = 0;
                  do {
                    fclose(local_1e8[uVar9]);
                    uVar9 = uVar9 + 1;
                  } while (uVar9 < local_270.number_spatial_layers);
                }
                fclose(pFVar5);
                return 0;
              }
              pcVar6 = "Failed to destroy codec";
              goto LAB_0011e45a;
            }
          }
        }
        pcVar6 = "Input is not a valid obu file";
      }
      else {
        pcVar6 = "Failed to set output_all_layers control.";
      }
LAB_0011e45a:
      die_codec(&local_220,pcVar6);
    }
    pcVar6 = "Failed to initialize decoder.";
  }
  else {
    pcVar6 = "Invalid number of arguments.";
  }
LAB_0011e46b:
  die(pcVar6);
}

Assistant:

int main(int argc, char **argv) {
  int frame_cnt = 0;
  FILE *outfile[MAX_LAYERS];
  char filename[80];
  FILE *inputfile = NULL;
  uint8_t *buf = NULL;
  size_t bytes_in_buffer = 0;
  size_t buffer_size = 0;
  struct AvxInputContext aom_input_ctx;
  struct ObuDecInputContext obu_ctx = { &aom_input_ctx, NULL, 0, 0, 0 };
  aom_codec_stream_info_t si;
  uint8_t tmpbuf[32];
  unsigned int i;

  exec_name = argv[0];

  if (argc != 2) die("Invalid number of arguments.");

  if (!(inputfile = fopen(argv[1], "rb")))
    die("Failed to open %s for read.", argv[1]);
  obu_ctx.avx_ctx->file = inputfile;
  obu_ctx.avx_ctx->filename = argv[1];

  aom_codec_iface_t *decoder = get_aom_decoder_by_index(0);
  printf("Using %s\n", aom_codec_iface_name(decoder));

  aom_codec_ctx_t codec;
  if (aom_codec_dec_init(&codec, decoder, NULL, 0))
    die("Failed to initialize decoder.");

  if (aom_codec_control(&codec, AV1D_SET_OUTPUT_ALL_LAYERS, 1)) {
    die_codec(&codec, "Failed to set output_all_layers control.");
  }

  // peak sequence header OBU to get number of spatial layers
  const size_t ret = fread(tmpbuf, 1, 32, inputfile);
  if (ret != 32) die_codec(&codec, "Input is not a valid obu file");
  si.is_annexb = 0;
  if (aom_codec_peek_stream_info(decoder, tmpbuf, 32, &si)) {
    die_codec(&codec, "Input is not a valid obu file");
  }
  fseek(inputfile, -32, SEEK_CUR);

  if (!file_is_obu(&obu_ctx))
    die_codec(&codec, "Input is not a valid obu file");

  // open base layer output yuv file
  snprintf(filename, sizeof(filename), "out_lyr%d.yuv", 0);
  if (!(outfile[0] = fopen(filename, "wb")))
    die("Failed top open output for writing.");

  // open any enhancement layer output yuv files
  for (i = 1; i < si.number_spatial_layers; i++) {
    snprintf(filename, sizeof(filename), "out_lyr%u.yuv", i);
    if (!(outfile[i] = fopen(filename, "wb")))
      die("Failed to open output for writing.");
  }

  while (!obudec_read_temporal_unit(&obu_ctx, &buf, &bytes_in_buffer,
                                    &buffer_size)) {
    aom_codec_iter_t iter = NULL;
    aom_image_t *img = NULL;
    if (aom_codec_decode(&codec, buf, bytes_in_buffer, NULL))
      die_codec(&codec, "Failed to decode frame.");

    while ((img = aom_codec_get_frame(&codec, &iter)) != NULL) {
      aom_image_t *img_shifted =
          aom_img_alloc(NULL, AOM_IMG_FMT_I420, img->d_w, img->d_h, 16);
      img_shifted->bit_depth = 8;
      aom_img_downshift(img_shifted, img,
                        img->bit_depth - img_shifted->bit_depth);
      if (img->spatial_id == 0) {
        printf("Writing        base layer 0 %d\n", frame_cnt);
        aom_img_write(img_shifted, outfile[0]);
      } else if (img->spatial_id <= (int)(si.number_spatial_layers - 1)) {
        printf("Writing enhancement layer %d %d\n", img->spatial_id, frame_cnt);
        aom_img_write(img_shifted, outfile[img->spatial_id]);
      } else {
        die_codec(&codec, "Invalid bitstream. Layer id exceeds layer count");
      }
      if (img->spatial_id == (int)(si.number_spatial_layers - 1)) ++frame_cnt;
    }
  }

  printf("Processed %d frames.\n", frame_cnt);
  if (aom_codec_destroy(&codec)) die_codec(&codec, "Failed to destroy codec");

  for (i = 0; i < si.number_spatial_layers; i++) fclose(outfile[i]);

  fclose(inputfile);

  return EXIT_SUCCESS;
}